

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRalgorithm.cpp
# Opt level: O0

void ToHessenbergForm(Matrix *m)

{
  double dVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  double *pdVar5;
  double dVar6;
  int local_ac;
  int i_1;
  double dot_1;
  Vector rowPart;
  int row;
  int i;
  double dot;
  Vector colPart;
  int column;
  int offset;
  Vector local_48;
  undefined1 local_30 [8];
  Vector w;
  int j;
  int n;
  Matrix *m_local;
  
  w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = Matrix::GetCols(m);
  for (w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      (int)w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage <
      w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ + -2;
      w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1) {
    Matrix::GetColPart(&local_48,m,
                       (int)w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                       (int)w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1,
                       w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_);
    GetW((Vector *)local_30,&local_48);
    std::vector<double,_std::allocator<double>_>::~vector(&local_48);
    iVar2 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_;
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_30);
    iVar2 = iVar2 - (int)sVar3;
    for (colPart.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage._4_4_ =
              (int)w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        colPart.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ <
        w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_;
        colPart.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             colPart.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      Matrix::GetColPart((Vector *)&dot,m,
                         colPart.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,
                         (int)w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1,
                         w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_);
      dVar6 = Utils::ScalarMultiply((Vector *)local_30,(Vector *)&dot);
      rowPart.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           (int)w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      while (rowPart.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ =
                  rowPart.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ + 1,
            rowPart.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ <
            w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_30,
                            (long)(rowPart.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ - iVar2))
        ;
        dVar1 = *pvVar4;
        pdVar5 = Matrix::operator()(m,rowPart.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                    colPart.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        *pdVar5 = -(dVar6 + dVar6) * dVar1 + *pdVar5;
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)&dot);
    }
    for (rowPart.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage._0_4_ = 0;
        (int)rowPart.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage <
        w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_;
        rowPart.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (int)rowPart.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      Matrix::GetRowPart((Vector *)&dot_1,m,
                         (int)rowPart.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                         (int)w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1,
                         w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_);
      dVar6 = Utils::ScalarMultiply((Vector *)local_30,(Vector *)&dot_1);
      local_ac = (int)w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
      while (local_ac = local_ac + 1,
            local_ac <
            w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_30,
                            (long)(local_ac - iVar2));
        dVar1 = *pvVar4;
        pdVar5 = Matrix::operator()(m,(int)rowPart.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                                    local_ac);
        *pdVar5 = -(dVar6 + dVar6) * dVar1 + *pdVar5;
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)&dot_1);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_30);
  }
  return;
}

Assistant:

void ToHessenbergForm(Matrix &m)
{
    int n = m.GetCols();

    for (int j = 0; j < n - 2; ++j)
    {
        Vector w = GetW(m.GetColPart(j, j + 1, n));
        int offset = n - w.size();

        // Transforming columns
        for (int column = j; column < n; ++column)
        {
            Vector colPart = m.GetColPart(column, j + 1, n);
            double dot = Utils::ScalarMultiply(w, colPart);
            for (int i = j + 1; i < n; ++i)
            {
                m(i, column) -= 2 * dot * w[i - offset];
            }
        }

        // Transforming rows
        for (int row = 0; row < n; ++row)
        {
            Vector rowPart = m.GetRowPart(row, j + 1, n);
            double dot = Utils::ScalarMultiply(w, rowPart);
            for (int i = j + 1; i < n; ++i)
            {
                m(row, i) -= 2 * dot * w[i - offset];
            }
        }
    }
}